

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O1

plutovg_font_face_t *
plutovg_font_face_load_from_data
          (void *data,uint length,int ttcindex,plutovg_destroy_func_t destroy_func,void *closure)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  stbtt__buf cff;
  stbtt__buf fontdict;
  stbtt__buf sVar4;
  ushort uVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  stbtt_uint32 sVar11;
  stbtt_uint32 sVar12;
  stbtt_uint32 sVar13;
  stbtt_uint32 sVar14;
  stbtt_uint32 sVar15;
  plutovg_font_face_t *ppVar17;
  long lVar18;
  uint uVar16;
  ulong uVar19;
  stbtt_uint32 fontstart;
  ulong uVar20;
  uchar *puVar21;
  stbtt__buf sVar22;
  stbtt__buf sVar23;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 cstype;
  stbtt_uint32 charstrings;
  stbtt_uint32 sVar24;
  undefined8 uVar25;
  stbtt_uint32 local_d4;
  stbtt_uint32 local_d0;
  stbtt_uint32 local_cc;
  uchar *in_stack_ffffffffffffff38;
  uchar *puVar26;
  stbtt__buf local_b0;
  uchar *local_a0;
  uint local_98;
  uint local_94;
  stbtt_uint32 local_7c;
  void *local_78;
  undefined8 local_70;
  uchar *local_68;
  undefined8 local_60;
  uchar *local_58;
  undefined8 local_50;
  uchar *local_48;
  stbtt__buf local_40;
  
  sVar22._8_8_ = local_60;
  sVar22.data = local_58;
  cVar1 = *data;
  if (((((cVar1 == '1') && (*(char *)((long)data + 1) == '\0')) &&
       (*(char *)((long)data + 2) == '\0')) && (*(char *)((long)data + 3) == '\0')) ||
     (((cVar1 == 't' && (*(char *)((long)data + 1) == 'y')) &&
      ((*(char *)((long)data + 2) == 'p' && (*(char *)((long)data + 3) == '1')))))) {
LAB_0012481c:
    fontstart = -(uint)(ttcindex != 0);
  }
  else {
    if (cVar1 == '\0') {
      if (((*(char *)((long)data + 1) != '\x01') || (*(char *)((long)data + 2) != '\0')) ||
         (*(char *)((long)data + 3) != '\0')) goto LAB_001247f5;
      goto LAB_0012481c;
    }
    if ((((cVar1 == 'O') && (*(char *)((long)data + 1) == 'T')) &&
        (*(char *)((long)data + 2) == 'T')) && (*(char *)((long)data + 3) == 'O'))
    goto LAB_0012481c;
LAB_001247f5:
    fontstart = 0xffffffff;
    if (cVar1 == 't') {
      if (*(char *)((long)data + 1) == 't') {
        if ((*(char *)((long)data + 2) == 'c') && (*(char *)((long)data + 3) == 'f')) {
          uVar16 = *(uint *)((long)data + 4);
          uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                   uVar16 << 0x18;
          if (((uVar16 == 0x20000) || (uVar16 == 0x10000)) &&
             (uVar16 = *(uint *)((long)data + 8),
             ttcindex <
             (int)(uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                  uVar16 << 0x18))) {
            uVar16 = *(uint *)((long)data + (long)ttcindex * 4 + 0xc);
            fontstart = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                        uVar16 << 0x18;
          }
        }
      }
      else if (((*(char *)((long)data + 1) == 'r') && (*(char *)((long)data + 2) == 'u')) &&
              (*(char *)((long)data + 3) == 'e')) goto LAB_0012481c;
    }
  }
  local_78 = closure;
  if (fontstart == 0xffffffff) goto LAB_00124961;
  sVar6 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"cmap");
  sVar7 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"loca");
  sVar8 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"head");
  sVar9 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"glyf");
  sVar10 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"hhea");
  sVar11 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"hmtx");
  sVar12 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"kern");
  sVar13 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"GPOS");
  sVar22.cursor = (undefined4)local_60;
  sVar22.size = local_60._4_4_;
  sVar22.data = local_58;
  sVar23.cursor = (undefined4)local_70;
  sVar23.size = local_70._4_4_;
  sVar23.data = local_68;
  bVar3 = true;
  sVar14 = sVar10;
  if ((sVar11 == 0 || sVar10 == 0) || (sVar8 == 0 || sVar6 == 0)) {
LAB_00124947:
    uVar25 = 0;
    puVar21 = (uchar *)0x0;
  }
  else if (sVar9 == 0) {
    local_cc = 2;
    local_7c = 0;
    local_d0 = 0;
    local_d4 = 0;
    sVar24 = sVar8;
    sVar15 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"CFF ");
    sVar22.cursor = (undefined4)local_60;
    sVar22.size = local_60._4_4_;
    sVar22.data = local_58;
    if (sVar15 == 0) {
      uVar25 = 0;
      puVar21 = (uchar *)0x0;
    }
    else {
      puVar21 = (uchar *)((ulong)sVar15 + (long)data);
      uVar25 = 0x2000000000000000;
      if (0x20000000 < puVar21[2]) goto LAB_00124ee9;
      puVar26 = puVar21;
      stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff40);
      sVar22 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff40);
      local_40 = stbtt__cff_index_get(sVar22,0);
      stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff40);
      sVar22 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff40);
      local_50 = sVar22._8_8_;
      local_48 = sVar22.data;
      stbtt__dict_get_ints(&local_40,0x11,1,&local_7c);
      stbtt__dict_get_ints(&local_40,0x106,1,&local_cc);
      stbtt__dict_get_ints(&local_40,0x124,1,&local_d0);
      stbtt__dict_get_ints(&local_40,0x125,1,&local_d4);
      cff.data._4_4_ = sVar24;
      cff.data._0_4_ = fontstart;
      cff.cursor = (int)uVar25;
      cff.size = (int)((ulong)uVar25 >> 0x20);
      fontdict._8_8_ = puVar26;
      fontdict.data = in_stack_ffffffffffffff38;
      sVar8 = sVar24;
      sVar22 = stbtt__get_subrs(cff,fontdict);
      sVar14 = local_7c;
      local_60 = sVar22._8_8_;
      local_58 = sVar22.data;
      if (local_7c != 0 && local_cc == 2) {
        if (local_d0 == 0) {
          local_a0 = (uchar *)0x0;
          local_b0 = (stbtt__buf)ZEXT816(0);
          in_stack_ffffffffffffff38 = (uchar *)0x0;
        }
        else {
          uVar20 = (ulong)local_d4;
          if (uVar20 == 0) goto LAB_00124dd1;
          if (((int)local_d0 < 0) || (0x20000000 < (int)local_d0)) goto LAB_00124ee9;
          local_b0 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff40);
          sVar22.cursor = (undefined4)local_60;
          sVar22.size = local_60._4_4_;
          sVar22.data = local_58;
          uVar16 = (uint)uVar20;
          in_stack_ffffffffffffff38 = puVar26 + uVar20;
          local_a0 = (uchar *)((ulong)(0x20000000 - uVar16) << 0x20);
          if ((int)(0x20000000 - uVar16 | uVar16) < 0 || 0x20000000 < (int)uVar16) {
            in_stack_ffffffffffffff38 = (uchar *)0x0;
            local_a0 = (uchar *)0x0;
          }
        }
        local_60 = sVar22._8_8_;
        local_58 = sVar22.data;
        if (((int)sVar14 < 0) || (0x20000000 < (int)sVar14)) {
LAB_00124ee9:
          local_60 = sVar22._8_8_;
          local_58 = sVar22.data;
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                        ,0x47d,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        sVar23 = stbtt__cff_get_index((stbtt__buf *)&stack0xffffffffffffff40);
        uVar25 = 0x2000000000000000;
        goto LAB_0012498d;
      }
    }
LAB_00124dd1:
    bVar3 = true;
    local_a0 = (uchar *)0x0;
    in_stack_ffffffffffffff38 = (uchar *)0x0;
    local_b0 = (stbtt__buf)ZEXT816(0);
  }
  else {
    uVar25 = 0;
    sVar14 = 0;
    if (sVar7 == 0) goto LAB_00124947;
    puVar21 = (uchar *)0x0;
LAB_0012498d:
    local_70 = sVar23._8_8_;
    local_68 = sVar23.data;
    bVar3 = true;
    sVar14 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"maxp");
    sVar22.cursor = (undefined4)local_60;
    sVar22.size = local_60._4_4_;
    sVar22.data = local_58;
    sVar4.cursor = (undefined4)local_60;
    sVar4.size = local_60._4_4_;
    sVar4.data = local_58;
    if (sVar14 == 0) {
      local_94 = 0xffff;
    }
    else {
      uVar5 = *(ushort *)((long)data + (ulong)sVar14 + 4);
      local_94 = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
    }
    uVar5 = *(ushort *)((long)data + (ulong)sVar6 + 2);
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    if (uVar5 == 0) {
      sVar14 = 0;
    }
    else {
      uVar16 = sVar6 + 4;
      uVar20 = (ulong)uVar5;
      sVar14 = 0;
      do {
        uVar19 = (ulong)uVar16;
        uVar5 = *(ushort *)((long)data + uVar19) << 8 | *(ushort *)((long)data + uVar19) >> 8;
        if ((uVar5 == 0) ||
           ((uVar5 == 3 &&
            ((uVar5 = *(ushort *)((long)data + uVar19 + 2), uVar5 = uVar5 << 8 | uVar5 >> 8,
             uVar5 == 10 || (uVar5 == 1)))))) {
          uVar2 = *(uint *)((long)data + uVar19 + 4);
          sVar14 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                   + sVar6;
        }
        uVar16 = uVar16 + 8;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    if (sVar14 != 0) {
      uVar5 = *(ushort *)((long)data + (long)(int)sVar8 + 0x32);
      local_98 = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
      bVar3 = false;
      sVar22 = sVar4;
    }
  }
  local_60 = sVar22._8_8_;
  local_58 = sVar22.data;
  if (!bVar3) {
    ppVar17 = (plutovg_font_face_t *)malloc(0x8d0);
    ppVar17->ref_count = 1;
    (ppVar17->info).data = (uchar *)data;
    (ppVar17->info).fontstart = fontstart;
    (ppVar17->info).numGlyphs = local_94;
    (ppVar17->info).loca = sVar7;
    (ppVar17->info).head = sVar8;
    (ppVar17->info).glyf = sVar9;
    (ppVar17->info).hhea = sVar10;
    (ppVar17->info).hmtx = sVar11;
    (ppVar17->info).kern = sVar12;
    (ppVar17->info).gpos = sVar13;
    (ppVar17->info).svg = -1;
    (ppVar17->info).index_map = sVar14;
    (ppVar17->info).indexToLocFormat = local_98;
    (ppVar17->info).cff.data = puVar21;
    (ppVar17->info).cff.cursor = (int)uVar25;
    (ppVar17->info).cff.size = (int)((ulong)uVar25 >> 0x20);
    (ppVar17->info).charstrings.data = local_68;
    (ppVar17->info).charstrings.cursor = (undefined4)local_70;
    (ppVar17->info).charstrings.size = local_70._4_4_;
    (ppVar17->info).gsubrs.data = local_48;
    (ppVar17->info).gsubrs.cursor = (undefined4)local_50;
    (ppVar17->info).gsubrs.size = local_50._4_4_;
    (ppVar17->info).subrs.data = local_58;
    (ppVar17->info).subrs.cursor = (undefined4)local_60;
    (ppVar17->info).subrs.size = local_60._4_4_;
    (ppVar17->info).fontdicts.data = local_b0.data;
    (ppVar17->info).fontdicts.cursor = local_b0.cursor;
    (ppVar17->info).fontdicts.size = local_b0.size;
    (ppVar17->info).fdselect.data = in_stack_ffffffffffffff38;
    *(uchar **)&(ppVar17->info).fdselect.cursor = local_a0;
    lVar18 = (long)(int)sVar10;
    ppVar17->ascent =
         (int)(short)((ushort)*(byte *)((long)data + lVar18 + 4) << 8) |
         (uint)*(byte *)((long)data + lVar18 + 5);
    ppVar17->descent =
         (int)(short)((ushort)*(byte *)((long)data + lVar18 + 6) << 8) |
         (uint)*(byte *)((long)data + lVar18 + 7);
    ppVar17->line_gap =
         (int)(short)((ushort)*(byte *)((long)data + lVar18 + 8) << 8) |
         (uint)*(byte *)((long)data + lVar18 + 9);
    lVar18 = (long)(int)sVar8;
    ppVar17->x1 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x24) << 8) |
                  (uint)*(byte *)((long)data + lVar18 + 0x25);
    ppVar17->y1 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x26) << 8) |
                  (uint)*(byte *)((long)data + lVar18 + 0x27);
    ppVar17->x2 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x28) << 8) |
                  (uint)*(byte *)((long)data + lVar18 + 0x29);
    ppVar17->y2 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x2a) << 8) |
                  (uint)*(byte *)((long)data + lVar18 + 0x2b);
    memset(ppVar17->glyphs,0,0x800);
    ppVar17->destroy_func = destroy_func;
    ppVar17->closure = local_78;
    return ppVar17;
  }
LAB_00124961:
  local_60 = sVar22._8_8_;
  local_58 = sVar22.data;
  if (destroy_func != (plutovg_destroy_func_t)0x0) {
    (*destroy_func)(local_78);
  }
  return (plutovg_font_face_t *)0x0;
}

Assistant:

plutovg_font_face_t* plutovg_font_face_load_from_data(const void* data, unsigned int length, int ttcindex, plutovg_destroy_func_t destroy_func, void* closure)
{
    stbtt_fontinfo info;
    int offset = stbtt_GetFontOffsetForIndex(data, ttcindex);
    if(offset == -1 || !stbtt_InitFont(&info, data, offset)) {
        if(destroy_func)
            destroy_func(closure);
        return NULL;
    }

    plutovg_font_face_t* face = malloc(sizeof(plutovg_font_face_t));
    face->ref_count = 1;
    face->info = info;
    stbtt_GetFontVMetrics(&face->info, &face->ascent, &face->descent, &face->line_gap);
    stbtt_GetFontBoundingBox(&face->info, &face->x1, &face->y1, &face->x2, &face->y2);
    memset(face->glyphs, 0, sizeof(face->glyphs));
    face->destroy_func = destroy_func;
    face->closure = closure;
    return face;
}